

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

string * METADemuxer::mplsTrackToFullName
                   (string *__return_storage_ptr__,string *mplsFileName,string *mplsNum)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator<char> local_169;
  undefined1 local_168 [8];
  string m2tsExt;
  undefined1 local_128 [8];
  string mplsExt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined4 local_7c;
  long local_78;
  size_t tmp;
  string local_60;
  undefined1 local_40 [8];
  string path;
  string *mplsNum_local;
  string *mplsFileName_local;
  
  path.field_2._8_8_ = mplsNum;
  extractFilePath(&local_60,mplsFileName);
  toNativeSeparators((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  cVar2 = getDirSeparator();
  local_78 = std::__cxx11::string::find_last_of((char)local_40,(ulong)(uint)(int)cVar2);
  if (local_78 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_7c = 1;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"STREAM",(allocator<char> *)(mplsExt.field_2._M_local_buf + 0xf)
              );
    std::operator+(&local_c0,&local_e0,&local_100);
    cVar2 = getDirSeparator();
    std::operator+(&local_a0,&local_c0,cVar2);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)(mplsExt.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_e0);
    extractFileExt((string *)((long)&m2tsExt.field_2 + 8),mplsFileName);
    strToLowerCase((string *)local_128,(string *)((long)&m2tsExt.field_2 + 8));
    std::__cxx11::string::~string((string *)(m2tsExt.field_2._M_local_buf + 8));
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_128,"mpls");
    pcVar1 = ".mts";
    if (bVar3) {
      pcVar1 = ".m2ts";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_168,pcVar1 + 1,&local_169);
    std::allocator<char>::~allocator(&local_169);
    std::operator+(&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   path.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,".",&local_1d1);
    std::operator+(&local_190,&local_1b0,&local_1d0);
    std::operator+(__return_storage_ptr__,&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::__cxx11::string::~string((string *)&local_1b0);
    local_7c = 1;
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)local_128);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string METADemuxer::mplsTrackToFullName(const std::string& mplsFileName, const std::string& mplsNum)
{
    string path = toNativeSeparators(extractFilePath(mplsFileName));
    const size_t tmp = path.find_last_of(getDirSeparator());
    if (tmp == string::npos)
        return {};
    path = path.substr(0, tmp + 1) + string("STREAM") + getDirSeparator();

    const string mplsExt = strToLowerCase(extractFileExt(mplsFileName));
    const string m2tsExt = (mplsExt == "mpls") ? "m2ts" : "mts";

    return path + mplsNum + string(".") + m2tsExt;
}